

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxshift.hpp
# Opt level: O2

void __thiscall soplex::SPxSolverBase<double>::unShift(SPxSolverBase<double> *this)

{
  double *pdVar1;
  double dVar2;
  Representation RVar3;
  uint uVar4;
  Status SVar5;
  pointer pdVar6;
  pointer pdVar7;
  Status *pSVar8;
  UpdateVector<double> *pUVar9;
  pointer pdVar10;
  pointer pdVar11;
  long lVar12;
  DataArray<soplex::SPxBasisBase<double>::Desc::Status> *pDVar13;
  int iVar14;
  SPxOut *pSVar15;
  pointer pdVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  Verbosity old_verbosity;
  SPxId l_id;
  double local_50;
  double local_48;
  double local_40;
  DataKey local_38;
  
  pSVar15 = this->spxout;
  if ((pSVar15 != (SPxOut *)0x0) && (4 < (int)pSVar15->m_verbosity)) {
    local_48 = (double)CONCAT44(local_48._4_4_,pSVar15->m_verbosity);
    local_50 = (double)CONCAT44(local_50._4_4_,5);
    (*pSVar15->_vptr_SPxOut[2])();
    pSVar15 = soplex::operator<<(this->spxout,"DSHIFT07 = ");
    pSVar15 = soplex::operator<<(pSVar15,"unshifting ...");
    std::endl<char,std::char_traits<char>>(pSVar15->m_streams[pSVar15->m_verbosity]);
    (*this->spxout->_vptr_SPxOut[2])(this->spxout,&local_48);
  }
  if (this->initialized == true) {
    this->theShift = 0.0;
    if (this->theType == ENTER) {
      local_40 = entertol(this);
      uVar19 = (ulong)(uint)(this->thecovectors->set).thenum;
      if (this->theRep == COLUMN) {
        do {
          if ((int)uVar19 < 1) {
            dVar20 = this->theShift;
            pSVar8 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
            pdVar6 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar16 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar7 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar10 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            uVar19 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                  super_SVSetBase<double>.set.thenum;
            do {
              lVar18 = 0;
              do {
                if ((int)uVar19 + (int)lVar18 < 1) {
                  pSVar8 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
                  pdVar6 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pdVar16 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  pdVar7 = (this->theUCbound).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  pdVar10 = (this->theLCbound).val.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  uVar19 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                        super_SVSetBase<double>.set.thenum;
                  do {
                    lVar18 = 0;
                    do {
                      if ((int)uVar19 + (int)lVar18 < 1) {
                        return;
                      }
                      lVar12 = lVar18 + -1;
                      lVar18 = lVar18 + -1;
                    } while (0 < pSVar8[uVar19 + lVar12] * this->theRep);
                    dVar2 = pdVar6[uVar19 + lVar18];
                    dVar22 = pdVar16[uVar19 + lVar18];
                    dVar21 = pdVar7[uVar19 + lVar18];
                    if (dVar2 < dVar21) {
                      dVar20 = dVar20 + (dVar21 - dVar2);
                      this->theShift = dVar20;
                    }
                    uVar17 = uVar19 + lVar18;
                    dVar2 = pdVar10[uVar19 + lVar18];
                    uVar19 = uVar17;
                    if (dVar2 < dVar22) {
                      dVar20 = dVar20 + (dVar22 - dVar2);
                      this->theShift = dVar20;
                    }
                  } while( true );
                }
                lVar12 = lVar18 + -1;
                lVar18 = lVar18 + -1;
              } while (0 < pSVar8[uVar19 + lVar12] * this->theRep);
              dVar2 = pdVar6[uVar19 + lVar18];
              dVar21 = -pdVar16[uVar19 + lVar18];
              dVar22 = pdVar7[uVar19 + lVar18];
              if (-dVar2 < dVar22) {
                dVar20 = dVar20 + dVar2 + dVar22;
                this->theShift = dVar20;
              }
              uVar17 = uVar19 + lVar18;
              dVar2 = pdVar10[uVar19 + lVar18];
              uVar19 = uVar17;
              if (dVar2 < dVar21) {
                dVar20 = dVar20 + (dVar21 - dVar2);
                this->theShift = dVar20;
              }
            } while( true );
          }
          local_38 = (this->super_SPxBasisBase<double>).theBaseId.data[uVar19 - 1].super_DataKey;
          iVar14 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,(SPxId *)&local_38);
          if (local_38.info < 0) {
            local_48 = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar14];
            local_50 = -(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar14];
          }
          else {
            local_48 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar14];
            local_50 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar14];
          }
          if ((local_48 != local_50) || (NAN(local_48) || NAN(local_50))) {
            pdVar6 = (this->theFvec->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            dVar20 = pdVar6[uVar19 + 0xffffffffffffffff];
            if (local_40 + local_48 <= dVar20) {
              if (local_48 < dVar20) {
                this->theShift =
                     ((this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar19 - 1] - local_48) +
                     this->theShift;
              }
            }
            else {
              (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19 - 1] = local_48;
            }
            dVar20 = pdVar6[uVar19 + 0xffffffffffffffff];
            if (dVar20 <= local_50 - local_40) {
              if (dVar20 < local_50) {
                dVar20 = this->theShift -
                         ((this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar19 - 1] - local_50);
                goto LAB_001bf9c8;
              }
            }
            else {
              (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar19 - 1] = local_50;
            }
          }
          else {
            dVar20 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
            if (dVar20 <= local_48) {
              dVar20 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
              if (dVar20 < local_50) {
                dVar20 = (local_50 - dVar20) + this->theShift;
LAB_001bf9c8:
                this->theShift = dVar20;
              }
            }
            else {
              this->theShift = (dVar20 - local_48) + this->theShift;
            }
          }
          uVar19 = uVar19 - 1;
        } while( true );
      }
      for (; 0 < (int)uVar19; uVar19 = uVar19 - 1) {
        local_38 = (this->super_SPxBasisBase<double>).theBaseId.data[uVar19 - 1].super_DataKey;
        iVar14 = SPxLPBase<double>::number(&this->super_SPxLPBase<double>,(SPxId *)&local_38);
        local_50 = 0.0;
        local_48 = 0.0;
        pDVar13 = &(this->super_SPxBasisBase<double>).thedesc.colstat;
        if (local_38.info < 0) {
          pDVar13 = &(this->super_SPxBasisBase<double>).thedesc.rowstat;
        }
        clearDualBounds(this,pDVar13->data[iVar14],&local_48,&local_50);
        pdVar6 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar16 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start;
        dVar20 = pdVar6[uVar19 - 1];
        if ((dVar20 != pdVar16[uVar19 - 1]) || (NAN(dVar20) || NAN(pdVar16[uVar19 - 1]))) {
          if (dVar20 <= local_48) {
            this->theShift = this->theShift - (dVar20 - local_48);
          }
          else {
            dVar20 = (dVar20 - local_48) + this->theShift;
LAB_001bff53:
            this->theShift = dVar20;
          }
        }
        else {
          pdVar7 = (this->theFvec->super_VectorBase<double>).val.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar2 = pdVar7[uVar19 + 0xffffffffffffffff];
          if (local_48 - local_40 <= dVar2) {
            if (local_48 < dVar2) {
              this->theShift = (dVar20 - local_48) + this->theShift;
            }
          }
          else {
            pdVar6[uVar19 - 1] = local_48;
          }
          dVar20 = pdVar7[uVar19 + 0xffffffffffffffff];
          if (dVar20 <= local_40 + local_50) {
            if (dVar20 < local_50) {
              dVar20 = this->theShift - (pdVar16[uVar19 - 1] - local_50);
              goto LAB_001bff53;
            }
          }
          else {
            pdVar16[uVar19 - 1] = local_50;
          }
        }
      }
      for (uVar19 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                 super_SVSetBase<double>.set.thenum; 0 < (int)uVar19;
          uVar19 = uVar19 - 1) {
        SVar5 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar19 - 1];
        if (this->theRep * SVar5 < 1) {
          local_50 = 0.0;
          local_48 = 0.0;
          clearDualBounds(this,SVar5,&local_48,&local_50);
          dVar20 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
          if (local_48 < dVar20) {
            this->theShift = (dVar20 - local_48) + this->theShift;
          }
          dVar20 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
          if (dVar20 < local_50) {
            this->theShift = (local_50 - dVar20) + this->theShift;
          }
        }
      }
      for (uVar19 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                 super_SVSetBase<double>.set.thenum; 0 < (int)uVar19;
          uVar19 = uVar19 - 1) {
        SVar5 = (this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar19 - 1];
        if (this->theRep * SVar5 < 1) {
          local_50 = 0.0;
          local_48 = 0.0;
          clearDualBounds(this,SVar5,&local_48,&local_50);
          dVar20 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
          if (local_48 < dVar20) {
            this->theShift = (dVar20 - local_48) + this->theShift;
          }
          dVar20 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
          if (dVar20 < local_50) {
            this->theShift = (local_50 - dVar20) + this->theShift;
          }
        }
      }
    }
    else {
      local_40 = leavetol(this);
      RVar3 = this->theRep;
      uVar4 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.set
              .thenum;
      uVar19 = (ulong)uVar4;
      if (RVar3 == COLUMN) {
        for (; 0 < (int)uVar19; uVar19 = uVar19 - 1) {
          local_50 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar19 - 1];
          local_48 = local_50;
          clearDualBounds(this,(this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar19 - 1],
                          &local_48,&local_50);
          if (this->theRep * (this->super_SPxBasisBase<double>).thedesc.rowstat.data[uVar19 - 1] < 1
             ) {
            pdVar6 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            pdVar16 = (this->theCoPvec->super_VectorBase<double>).val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar1 = pdVar16 + uVar19 + 0xffffffffffffffff;
            if (local_40 + local_48 < *pdVar1 || local_40 + local_48 == *pdVar1) {
              this->theShift = (pdVar6[uVar19 - 1] - local_48) + this->theShift;
            }
            else {
              pdVar6[uVar19 - 1] = local_48;
              if ((local_48 == local_50) && (!NAN(local_48) && !NAN(local_50))) {
                (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19 - 1] = local_50;
              }
            }
            pdVar7 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (pdVar16[uVar19 + 0xffffffffffffffff] <= local_50 - local_40) {
              dVar20 = local_50 - pdVar7[uVar19 - 1];
              goto LAB_001bf801;
            }
            pdVar7[uVar19 - 1] = local_50;
            if ((local_48 == local_50) && (!NAN(local_48) && !NAN(local_50))) {
              pdVar6[uVar19 - 1] = local_48;
            }
          }
          else {
            dVar20 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
            if ((local_48 < dVar20) ||
               (local_48 = (this->theLRbound).val.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar19 - 1], dVar20 = local_50,
               local_48 < local_50)) {
              dVar20 = dVar20 - local_48;
LAB_001bf801:
              this->theShift = dVar20 + this->theShift;
            }
          }
        }
        for (uVar19 = (ulong)(uint)(this->super_SPxLPBase<double>).super_LPColSetBase<double>.
                                   super_SVSetBase<double>.set.thenum; 0 < (int)uVar19;
            uVar19 = uVar19 - 1) {
          local_50 = -(this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar19 - 1];
          local_48 = local_50;
          clearDualBounds(this,(this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar19 - 1],
                          &local_50,&local_48);
          if (this->theRep * (this->super_SPxBasisBase<double>).thedesc.colstat.data[uVar19 - 1] < 1
             ) {
            pdVar6 = (this->thePvec->super_VectorBase<double>).val.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar1 = pdVar6 + uVar19 + 0xffffffffffffffff;
            if (local_40 - local_48 < *pdVar1 || local_40 - local_48 == *pdVar1) {
              pdVar16 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              this->theShift = local_48 + pdVar16[uVar19 - 1] + this->theShift;
            }
            else {
              pdVar16 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              pdVar16[uVar19 - 1] = -local_48;
              if ((local_48 == local_50) && (!NAN(local_48) && !NAN(local_50))) {
                (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar19 - 1] = -local_50;
              }
            }
            pdVar7 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            if (pdVar6[uVar19 + 0xffffffffffffffff] <= -local_50 - local_40) {
              dVar20 = pdVar7[uVar19 - 1];
LAB_001bfb71:
              dVar20 = -local_50 - dVar20;
              goto LAB_001bfb75;
            }
            pdVar7[uVar19 - 1] = -local_50;
            if ((local_48 == local_50) && (!NAN(local_48) && !NAN(local_50))) {
              pdVar16[uVar19 - 1] = -local_48;
            }
          }
          else {
            dVar20 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
            if (dVar20 <= -local_48) {
              dVar20 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start[uVar19 - 1];
              if (dVar20 < -local_50) goto LAB_001bfb71;
            }
            else {
              dVar20 = dVar20 + local_48;
LAB_001bfb75:
              this->theShift = dVar20 + this->theShift;
            }
          }
        }
      }
      else {
        pSVar8 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
        pUVar9 = this->thePvec;
        pdVar6 = (this->theLRbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar16 = (this->theURbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pdVar7 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar10 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (lVar18 = 0; 0 < (int)(uVar4 + (int)lVar18); lVar18 = lVar18 + -1) {
          dVar20 = pdVar10[uVar19 + lVar18 + -1];
          dVar2 = pdVar7[uVar19 + lVar18 + -1];
          if ((dVar20 != dVar2) || (NAN(dVar20) || NAN(dVar2))) {
            if (0 < pSVar8[uVar19 + lVar18 + -1] * RVar3) {
              dVar22 = pdVar16[uVar19 + lVar18 + -1];
              if (dVar20 < dVar22) goto LAB_001bfc3a;
              dVar20 = pdVar6[uVar19 + lVar18 + -1];
              if (dVar2 <= dVar20) goto LAB_001bfc4e;
              goto LAB_001bfc11;
            }
            pdVar11 = (pUVar9->super_VectorBase<double>).val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar1 = pdVar11 + uVar19 + lVar18 + 0xffffffffffffffffU;
            if (local_40 + dVar20 < *pdVar1 || local_40 + dVar20 == *pdVar1) {
              this->theShift = (pdVar16[uVar19 + lVar18 + -1] - dVar20) + this->theShift;
            }
            else {
              pdVar16[uVar19 + lVar18 + -1] = dVar20;
            }
            if (pdVar11[uVar19 + lVar18 + 0xffffffffffffffffU] <= dVar2 - local_40)
            goto LAB_001bfc0b;
            pdVar6[uVar19 + lVar18 + -1] = dVar2;
          }
          else {
            dVar22 = pdVar16[uVar19 + lVar18 + -1];
            if (dVar20 < dVar22) {
LAB_001bfc3a:
              this->theShift = (dVar22 - dVar20) + this->theShift;
            }
            else {
LAB_001bfc0b:
              dVar20 = pdVar6[uVar19 + lVar18 + -1];
LAB_001bfc11:
              this->theShift = (dVar2 - dVar20) + this->theShift;
            }
          }
LAB_001bfc4e:
        }
        uVar4 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.super_SVSetBase<double>.
                set.thenum;
        pSVar8 = (this->super_SPxBasisBase<double>).thedesc.colstat.data;
        pUVar9 = this->theCoPvec;
        pdVar6 = (this->theLCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar16 = (this->theUCbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start;
        pdVar7 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.low.val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar10 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.up.val.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        for (lVar18 = 0; 0 < (int)(uVar4 + (int)lVar18); lVar18 = lVar18 + -1) {
          dVar20 = pdVar10[(ulong)uVar4 + lVar18 + -1];
          dVar2 = pdVar7[(ulong)uVar4 + lVar18 + -1];
          if ((dVar20 != dVar2) || (NAN(dVar20) || NAN(dVar2))) {
            if (0 < pSVar8[(ulong)uVar4 + lVar18 + -1] * RVar3) {
              dVar22 = pdVar16[(ulong)uVar4 + lVar18 + -1];
              if (dVar20 < dVar22) goto LAB_001bfd7d;
              dVar20 = pdVar6[(ulong)uVar4 + lVar18 + -1];
              if (dVar2 <= dVar20) goto LAB_001bfd91;
              goto LAB_001bfd54;
            }
            pdVar11 = (pUVar9->super_VectorBase<double>).val.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            pdVar1 = pdVar11 + (ulong)uVar4 + lVar18 + 0xffffffffffffffffU;
            if (local_40 + dVar20 < *pdVar1 || local_40 + dVar20 == *pdVar1) {
              this->theShift = (pdVar16[(ulong)uVar4 + lVar18 + -1] - dVar20) + this->theShift;
            }
            else {
              pdVar16[(ulong)uVar4 + lVar18 + -1] = dVar20;
            }
            if (pdVar11[(ulong)uVar4 + lVar18 + 0xffffffffffffffffU] <= dVar2 - local_40)
            goto LAB_001bfd4e;
            pdVar6[(ulong)uVar4 + lVar18 + -1] = dVar2;
          }
          else {
            dVar22 = pdVar16[(ulong)uVar4 + lVar18 + -1];
            if (dVar20 < dVar22) {
LAB_001bfd7d:
              this->theShift = (dVar22 - dVar20) + this->theShift;
            }
            else {
LAB_001bfd4e:
              dVar20 = pdVar6[(ulong)uVar4 + lVar18 + -1];
LAB_001bfd54:
              this->theShift = (dVar2 - dVar20) + this->theShift;
            }
          }
LAB_001bfd91:
        }
      }
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::unShift(void)
{
   SPX_MSG_INFO3((*this->spxout), (*this->spxout) << "DSHIFT07 = " << "unshifting ..." << std::endl;);

   if(isInitialized())
   {
      int i;
      R t_up, t_low;
      const typename SPxBasisBase<R>::Desc& ds = this->desc();

      theShift = 0;

      if(type() == ENTER)
      {
         R eps = entertol();

         if(rep() == COLUMN)
         {
            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);

               if(l_id.type() == SPxId::ROW_ID)
               {
                  t_up = -this->lhs(l_num);
                  t_low = -this->rhs(l_num);
               }
               else
               {
                  assert(l_id.type() == SPxId::COL_ID);
                  t_up = this->upper(l_num);
                  t_low = this->lower(l_num);
               }

               if(t_up != t_low)
               {
                  if((*theFvec)[i] < t_up + eps)  // check allowed violation
                     theUBbound[i] = t_up; // reset shifted bound to original
                  else if((*theFvec)[i] > t_up)  // shifted bound is required for feasibility
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low - eps)  // check allowed violation
                     theLBbound[i] = t_low; // reset shifted bound to original
                  else if((*theFvec)[i] < t_low)  // shifted bound is required for feasibility
                     theShift -= theLBbound[i] - t_low;
               }
               else
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else if(theLBbound[i] < t_low)
                     theShift += t_low - theLBbound[i];
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = -this->lhs(i);
                  t_low = -this->rhs(i);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = this->upper(i);
                  t_low = this->lower(i);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = dim(); i-- > 0;)
            {
               SPxId l_id = this->baseId(i);
               int l_num = this->number(l_id);
               t_up = t_low = 0;

               if(l_id.type() == SPxId::ROW_ID)
                  clearDualBounds(ds.rowStatus(l_num), t_up, t_low);
               else
                  clearDualBounds(ds.colStatus(l_num), t_up, t_low);

               if(theUBbound[i] != theLBbound[i])
               {
                  if(theUBbound[i] > t_up)
                     theShift += theUBbound[i] - t_up;
                  else
                     theShift -= theUBbound[i] - t_up;
               }
               else
               {
                  /* if the basic (primal or dual) variable is fixed (e.g., basis status P_FREE in row representation)
                   * then shiftFvec() and shiftPvec() do not relax the bounds, but shift both, hence they may be outside
                   * of [t_low,t_up] */
                  assert(theLBbound[i] == theUBbound[i] || theUBbound[i] >= t_up);
                  assert(theLBbound[i] == theUBbound[i] || theLBbound[i] <= t_low);

                  if((*theFvec)[i] < t_up - eps)
                     theUBbound[i] = t_up;
                  else if((*theFvec)[i] > t_up)
                     theShift += theUBbound[i] - t_up;

                  if((*theFvec)[i] > t_low + eps)
                     theLBbound[i] = t_low;
                  else if((*theFvec)[i] < t_low)
                     theShift -= theLBbound[i] - t_low;
               }
            }

            for(i = this->nRows(); i-- > 0;)
            {
               if(!isBasic(ds.rowStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.rowStatus(i), t_up, t_low);

                  if(theURbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theURbound[i] - t_up;

                  if(t_low > theLRbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLRbound[i];
               }
            }

            for(i = this->nCols(); i-- > 0;)
            {
               if(!isBasic(ds.colStatus(i)))
               {
                  t_up = t_low = 0;
                  clearDualBounds(ds.colStatus(i), t_up, t_low);

                  if(theUCbound[i] > t_up)  // what about t_up == t_low ?
                     theShift += theUCbound[i] - t_up;

                  if(t_low > theLCbound[i])  // what about t_up == t_low ?
                     theShift += t_low - theLCbound[i];
               }
            }
         }
      }
      else
      {
         assert(type() == LEAVE);

         R eps = leavetol();

         if(rep() == COLUMN)
         {
            for(i = this->nRows(); i-- > 0;)
            {
               t_up = t_low = this->maxRowObj(i);
               clearDualBounds(ds.rowStatus(i), t_up, t_low);

               if(!isBasic(ds.rowStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                  {
                     theURbound[i] = t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLRbound[i] = t_low; // for fixed rows we change both bounds
                  }
                  else
                     theShift += theURbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                  {
                     theLRbound[i] = t_low; // reset bound to original value

                     if(t_up == t_low)
                        theURbound[i] = t_up; // for fixed rows we change both bounds
                  }
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = t_low = -this->maxObj(i);
               clearDualBounds(ds.colStatus(i), t_low, t_up);

               if(!isBasic(ds.colStatus(i)))
               {
                  if((*thePvec)[i] < -t_up + eps)
                  {
                     theUCbound[i] = -t_up; // reset bound to original value

                     if(t_up == t_low)
                        theLCbound[i] = -t_low; // for fixed variables we change both bounds
                  }
                  else
                     theShift += theUCbound[i] - (-t_up);

                  if((*thePvec)[i] > -t_low - eps)
                  {
                     theLCbound[i] = -t_low; // reset bound to original value

                     if(t_up == t_low)
                        theUCbound[i] = -t_up; // for fixed variables we change both bounds
                  }
                  else
                     theShift += (-t_low) - theLCbound[i];
               }
               else if(theUCbound[i] > -t_up)
                  theShift += theUCbound[i] - (-t_up);
               else if(theLCbound[i] < -t_low)
                  theShift += (-t_low) - theLCbound[i];
            }
         }
         else
         {
            assert(rep() == ROW);

            for(i = this->nRows(); i-- > 0;)
            {
               t_up = this->rhs(i);
               t_low = this->lhs(i);

               if(t_up == t_low)
               {
                  if(theURbound[i] > t_up)
                     theShift += theURbound[i] - t_up;
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(!isBasic(ds.rowStatus(i)))
               {
                  if((*thePvec)[i] < t_up + eps)
                     theURbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theURbound[i] - t_up;

                  if((*thePvec)[i] > t_low - eps)
                     theLRbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLRbound[i];
               }
               else if(theURbound[i] > t_up)
                  theShift += theURbound[i] - t_up;
               else if(theLRbound[i] < t_low)
                  theShift += t_low - theLRbound[i];
            }

            for(i = this->nCols(); i-- > 0;)
            {
               t_up = this->upper(i);
               t_low = this->lower(i);

               if(t_up == t_low)
               {
                  if(theUCbound[i] > t_up)
                     theShift += theUCbound[i] - t_up;
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(!isBasic(ds.colStatus(i)))
               {
                  if((*theCoPvec)[i] < t_up + eps)
                     theUCbound[i] = t_up; // reset bound to original value
                  else
                     theShift += theUCbound[i] - t_up;

                  if((*theCoPvec)[i] > t_low - eps)
                     theLCbound[i] = t_low; // reset bound to original value
                  else
                     theShift += t_low - theLCbound[i];
               }
               else if(theUCbound[i] > t_up)
                  theShift += theUCbound[i] - t_up;
               else if(theLCbound[i] < t_low)
                  theShift += t_low - theLCbound[i];
            }
         }
      }
   }
}